

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.cpp
# Opt level: O1

void gpu::uploadShaderSources<char_const*,char*>(u32 shader,char **xs,char **xs_1)

{
  i32 sizes [2];
  char *srcs [2];
  u32 local_40;
  u32 local_3c;
  char *local_38;
  char *local_30;
  
  local_38 = *xs;
  local_30 = *xs_1;
  local_40 = tl::strlen<char>(local_38);
  local_3c = tl::strlen<char>(*xs_1);
  (*glad_debug_glShaderSource)(shader,2,&local_38,(GLint *)&local_40);
  return;
}

Assistant:

void uploadShaderSources(u32 shader, const Ts&... xs)
{
    const char* const srcs[] = { xs... };
    const i32 sizes[] = { strlenGeneric(xs)... };
   glShaderSource(shader, sizeof...(xs), srcs, sizes);
}